

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O3

int xhtmlIsEmpty(xmlNodePtr node)

{
  int iVar1;
  uint uVar2;
  char *str2;
  xmlChar *str1;
  
  if (node == (xmlNodePtr)0x0) {
    uVar2 = 0xffffffff;
  }
  else {
    uVar2 = 0;
    if (((node->type == XML_ELEMENT_NODE) &&
        (((node->ns == (xmlNs *)0x0 ||
          (iVar1 = xmlStrEqual(node->ns->href,(xmlChar *)"http://www.w3.org/1999/xhtml"), iVar1 != 0
          )) && (node->children == (_xmlNode *)0x0)))) &&
       (str1 = node->name, uVar2 = 0, str1 != (xmlChar *)0x0)) {
      switch(*str1) {
      case 'a':
        str2 = "area";
        break;
      case 'b':
        iVar1 = xmlStrEqual(str1,"br");
        if (iVar1 != 0) {
          return 1;
        }
        iVar1 = xmlStrEqual(node->name,"base");
        if (iVar1 != 0) {
          return 1;
        }
        str1 = node->name;
        str2 = "basefont";
        break;
      case 'c':
        str2 = "col";
        break;
      default:
        goto switchD_00170247_caseD_64;
      case 'f':
        str2 = "frame";
        break;
      case 'h':
        str2 = "hr";
        break;
      case 'i':
        iVar1 = xmlStrEqual(str1,(xmlChar *)"img");
        if (iVar1 != 0) {
          return 1;
        }
        iVar1 = xmlStrEqual(node->name,"input");
        if (iVar1 != 0) {
          return 1;
        }
        str1 = node->name;
        str2 = "isindex";
        break;
      case 'l':
        str2 = "link";
        break;
      case 'm':
        str2 = "meta";
        break;
      case 'p':
        str2 = "param";
      }
      iVar1 = xmlStrEqual(str1,(xmlChar *)str2);
      uVar2 = (uint)(iVar1 != 0);
    }
  }
switchD_00170247_caseD_64:
  return uVar2;
}

Assistant:

static int
xhtmlIsEmpty(xmlNodePtr node) {
    if (node == NULL)
	return(-1);
    if (node->type != XML_ELEMENT_NODE)
	return(0);
    if ((node->ns != NULL) && (!xmlStrEqual(node->ns->href, XHTML_NS_NAME)))
	return(0);
    if (node->children != NULL)
	return(0);
    switch (node->name ? node->name[0] : 0) {
	case 'a':
	    if (xmlStrEqual(node->name, BAD_CAST "area"))
		return(1);
	    return(0);
	case 'b':
	    if (xmlStrEqual(node->name, BAD_CAST "br"))
		return(1);
	    if (xmlStrEqual(node->name, BAD_CAST "base"))
		return(1);
	    if (xmlStrEqual(node->name, BAD_CAST "basefont"))
		return(1);
	    return(0);
	case 'c':
	    if (xmlStrEqual(node->name, BAD_CAST "col"))
		return(1);
	    return(0);
	case 'f':
	    if (xmlStrEqual(node->name, BAD_CAST "frame"))
		return(1);
	    return(0);
	case 'h':
	    if (xmlStrEqual(node->name, BAD_CAST "hr"))
		return(1);
	    return(0);
	case 'i':
	    if (xmlStrEqual(node->name, BAD_CAST "img"))
		return(1);
	    if (xmlStrEqual(node->name, BAD_CAST "input"))
		return(1);
	    if (xmlStrEqual(node->name, BAD_CAST "isindex"))
		return(1);
	    return(0);
	case 'l':
	    if (xmlStrEqual(node->name, BAD_CAST "link"))
		return(1);
	    return(0);
	case 'm':
	    if (xmlStrEqual(node->name, BAD_CAST "meta"))
		return(1);
	    return(0);
	case 'p':
	    if (xmlStrEqual(node->name, BAD_CAST "param"))
		return(1);
	    return(0);
    }
    return(0);
}